

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O0

void init_fill(level *lev,schar bg_typ,schar fg_typ)

{
  int iVar1;
  int iVar2;
  long local_30;
  long count;
  long limit;
  int j;
  int i;
  schar fg_typ_local;
  schar bg_typ_local;
  level *lev_local;
  
  if (fg_typ < '\'') {
    local_30 = 0;
    while (local_30 < 0x270) {
      iVar1 = rn2(0x4d);
      iVar2 = rnd(0x13);
      if (lev->locations[iVar1 + 2][iVar2].typ == bg_typ) {
        lev->locations[iVar1 + 2][iVar2].typ = fg_typ;
        local_30 = local_30 + 1;
      }
    }
  }
  return;
}

Assistant:

static void init_fill(struct level *lev, schar bg_typ, schar fg_typ)
{
	int i,j;
	long limit, count;

	if (fg_typ >= MAX_TYPE) return;

	limit = (WIDTH * HEIGHT * 2) / 5;
	count = 0;
	while (count < limit) {
	    i = rn1(WIDTH-1, 2);
	    j = rnd(HEIGHT-1);
	    if (lev->locations[i][j].typ == bg_typ) {
		lev->locations[i][j].typ = fg_typ;
		count++;
	    }
	}
}